

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void av1_init_simple_motion_search_mvs_for_sb
               (AV1_COMP *cpi,TileInfo *tile_info,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_root,
               int mi_row,int mi_col)

{
  int iVar1;
  FULLPEL_MV FVar2;
  long lVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  FULLPEL_MV *start_mvs;
  int ref_frame;
  MB_MODE_INFO_EXT mbmi_ext;
  BLOCK_SIZE sb_size;
  FULLPEL_MV ref_mvs [8];
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  SIMPLE_MOTION_DATA_TREE *sms_tree;
  undefined8 in_stack_fffffffffffffa70;
  BLOCK_SIZE bsize;
  undefined8 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  AV1_COMP *in_stack_fffffffffffffa90;
  CANDIDATE_MV (*in_stack_fffffffffffffad8) [8];
  uint8_t *in_stack_fffffffffffffae0;
  MV_REFERENCE_FRAME in_stack_fffffffffffffaef;
  MB_MODE_INFO *in_stack_fffffffffffffaf0;
  MACROBLOCKD *in_stack_fffffffffffffaf8;
  AV1_COMMON *in_stack_fffffffffffffb00;
  uint16_t (*in_stack_fffffffffffffb20) [8];
  int_mv (*in_stack_fffffffffffffb28) [2];
  int_mv *in_stack_fffffffffffffb30;
  int16_t *in_stack_fffffffffffffb38;
  char acStack_e8 [32];
  MV aMStack_c8 [23];
  undefined1 local_69;
  FULLPEL_MV local_68 [10];
  long local_40;
  long local_38;
  long local_18;
  long local_10;
  
  bsize = (BLOCK_SIZE)((ulong)in_stack_fffffffffffffa70 >> 0x38);
  local_38 = in_RDI + 0x3bf80;
  local_40 = in_RDX + 0x1a0;
  local_69 = *(undefined1 *)(*(long *)(in_RDI + 0x42008) + 0x1c);
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_68,0,0x20);
  if (local_18 != 0) {
    av1_set_offsets_without_segment_id
              (in_stack_fffffffffffffa90,
               (TileInfo *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),(int)in_stack_fffffffffffffa78,bsize)
    ;
  }
  iVar1 = 1;
  if (*(int *)(local_10 + 0x607a8) != 0) {
    iVar1 = 7;
  }
  start_mvs = (FULLPEL_MV *)(local_40 + 0x27b8);
  sms_tree = (SIMPLE_MOTION_DATA_TREE *)0x0;
  av1_find_mv_refs(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
                   in_stack_fffffffffffffaef,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                   in_stack_fffffffffffffb20,in_stack_fffffffffffffb28,in_stack_fffffffffffffb30,
                   in_stack_fffffffffffffb38);
  if (acStack_e8[iVar1] == '\0') {
    lVar3 = (long)iVar1;
    FVar2 = get_fullmv_from_mv(aMStack_c8 + iVar1);
    local_68[lVar3] = FVar2;
  }
  else {
    lVar3 = (long)iVar1;
    FVar2 = get_fullmv_from_mv((MV *)(local_40 + 0x2078 + (long)iVar1 * 0x40));
    local_68[lVar3] = FVar2;
  }
  init_simple_motion_search_mvs(sms_tree,start_mvs);
  return;
}

Assistant:

void av1_init_simple_motion_search_mvs_for_sb(const AV1_COMP *cpi,
                                              const TileInfo *tile_info,
                                              MACROBLOCK *x,
                                              SIMPLE_MOTION_DATA_TREE *sms_root,
                                              int mi_row, int mi_col) {
  // Use the NEARESTMV of the sb as the start mv
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  FULLPEL_MV ref_mvs[REF_FRAMES];
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
  av1_zero(ref_mvs);
  // If tile_info is NULL, assume that the offsets have already been set.
  if (tile_info) {
    av1_set_offsets_without_segment_id(cpi, tile_info, x, mi_row, mi_col,
                                       sb_size);
  }

  MB_MODE_INFO_EXT mbmi_ext;
  const int ref_frame =
      cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME : LAST_FRAME;
  av1_find_mv_refs(cm, xd, xd->mi[0], ref_frame, mbmi_ext.ref_mv_count,
                   xd->ref_mv_stack, xd->weight, NULL, mbmi_ext.global_mvs,
                   mbmi_ext.mode_context);
  if (mbmi_ext.ref_mv_count[ref_frame] > 0) {
    ref_mvs[ref_frame] =
        get_fullmv_from_mv(&xd->ref_mv_stack[ref_frame][0].this_mv.as_mv);
  } else {
    ref_mvs[ref_frame] =
        get_fullmv_from_mv(&mbmi_ext.global_mvs[ref_frame].as_mv);
  }

  init_simple_motion_search_mvs(sms_root, ref_mvs);
}